

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

void __thiscall
el::base::TypedConfigurations::build(TypedConfigurations *this,Configurations *configurations)

{
  ConfigurationType CVar1;
  Level LVar2;
  Level level;
  pointer pcVar3;
  long lVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unsigned_long uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Alloc_hider _Var9;
  Configuration **ppCVar10;
  bool bVar11;
  vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> withFileSizeLimit;
  Configuration *conf;
  Configuration **local_228;
  iterator iStack_220;
  Configuration **local_218;
  TypedConfigurations *local_208;
  Configuration *local_200;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  undefined8 local_178;
  undefined8 uStack_170;
  code *local_168;
  code *pcStack_160;
  map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
  *local_f8;
  map<el::Level,_el::base::MillisecondsWidth,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::MillisecondsWidth>_>_>
  *local_f0;
  map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  *local_e8;
  map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
  *local_e0;
  map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  *local_d8;
  map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  *local_d0;
  map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  *local_c8;
  map<el::Level,_el::base::LogFormat,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
  *local_c0;
  long *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string_t local_50;
  long *plVar6;
  
  (*(this->super_ThreadSafe)._vptr_ThreadSafe[2])();
  local_228 = (Configuration **)0x0;
  iStack_220._M_current = (Configuration **)0x0;
  local_218 = (Configuration **)0x0;
  iVar5 = (*(configurations->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>
            ).
            super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
            .super_ThreadSafe._vptr_ThreadSafe[5])(configurations);
  plVar6 = (long *)CONCAT44(extraout_var,iVar5);
  local_e0 = &this->m_maxLogFileSizeMap;
  local_e8 = &this->m_performanceTrackingMap;
  local_f0 = &this->m_millisecondsWidthMap;
  local_c0 = &this->m_logFormatMap;
  local_f8 = &this->m_logFlushThresholdMap;
  local_c8 = &this->m_toStandardOutputMap;
  local_d0 = &this->m_toFileMap;
  local_d8 = &this->m_enabledMap;
  local_208 = this;
  do {
    iVar5 = (*(configurations->
              super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
              super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              .super_ThreadSafe._vptr_ThreadSafe[6])(configurations);
    if (plVar6 == (long *)CONCAT44(extraout_var_00,iVar5)) {
      iVar5 = (*(configurations->
                super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
                super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                .super_ThreadSafe._vptr_ThreadSafe[5])(configurations);
      for (plVar6 = (long *)CONCAT44(extraout_var_01,iVar5);
          iVar5 = (*(configurations->
                    super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
                    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                    .super_ThreadSafe._vptr_ThreadSafe[6])(configurations),
          plVar6 != (long *)CONCAT44(extraout_var_02,iVar5); plVar6 = plVar6 + 1) {
        lVar4 = *plVar6;
        if (*(short *)(lVar4 + 10) == 0x10) {
          insertFile(this,*(Level *)(lVar4 + 8),(string *)(lVar4 + 0x10));
        }
      }
      if (local_228 != iStack_220._M_current) {
        ppCVar10 = local_228;
        do {
          uStack_170 = 0;
          local_178 = defaultPreRollOutCallback;
          pcStack_160 = std::
                        _Function_handler<void_(const_char_*,_unsigned_long),_void_(*)(const_char_*,_unsigned_long)>
                        ::_M_invoke;
          local_168 = std::
                      _Function_handler<void_(const_char_*,_unsigned_long),_void_(*)(const_char_*,_unsigned_long)>
                      ::_M_manager;
          unsafeValidateFileRolling(this,(*ppCVar10)->m_level,(PreRollOutCallback *)&local_178);
          if (local_168 != (code *)0x0) {
            (*local_168)((PreRollOutCallback *)&local_178,(PreRollOutCallback *)&local_178,3);
          }
          ppCVar10 = ppCVar10 + 1;
        } while (ppCVar10 != iStack_220._M_current);
      }
      if (local_228 != (Configuration **)0x0) {
        operator_delete(local_228);
      }
      return;
    }
    local_200 = (Configuration *)*plVar6;
    CVar1 = local_200->m_configurationType;
    if ((Filename|Format|ToStandardOutput|ToFile|Enabled) < CVar1) {
      if (CVar1 < MaxLogFileSize) {
        if (CVar1 == MillisecondsWidth) {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          pcVar3 = (local_200->m_value)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar3,pcVar3 + (local_200->m_value)._M_string_length);
          uVar7 = getULong(this,&local_70);
          local_178._0_4_ = (int)uVar7;
          if ((int)local_178 - 7U < 0xfffffffa) {
            local_178._0_4_ = 3;
          }
          switch((int)local_178) {
          default:
            local_178._4_4_ = 1000;
            break;
          case 4:
            local_178._4_4_ = 100;
            break;
          case 5:
            local_178._4_4_ = 10;
            break;
          case 6:
            local_178._4_4_ = 1;
          }
          setValue<el::base::MillisecondsWidth>
                    (this,Global,(MillisecondsWidth *)&local_178,local_f0,true);
          paVar8 = &local_70.field_2;
          _Var9._M_p = local_70._M_dataplus._M_p;
        }
        else {
          if (CVar1 != PerformanceTracking) goto switchD_0011a913_caseD_3;
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          pcVar3 = (local_200->m_value)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1f8,pcVar3,pcVar3 + (local_200->m_value)._M_string_length);
          utils::Str::trim(&local_1f8);
          iVar5 = std::__cxx11::string::compare((char *)&local_1f8);
          bVar11 = true;
          if ((iVar5 != 0) &&
             (iVar5 = std::__cxx11::string::compare((char *)&local_1f8), iVar5 != 0)) {
            iVar5 = std::__cxx11::string::compare((char *)&local_1f8);
            bVar11 = iVar5 == 0;
          }
          local_178._0_1_ = bVar11;
          setValue<bool>(this,Global,(bool *)&local_178,local_e8,true);
          paVar8 = &local_1f8.field_2;
          _Var9._M_p = local_1f8._M_dataplus._M_p;
        }
        goto LAB_0011aeca;
      }
      if (CVar1 == MaxLogFileSize) {
        LVar2 = local_200->m_level;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar3 = (local_200->m_value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar3,pcVar3 + (local_200->m_value)._M_string_length);
        local_178 = (code *)getULong(this,&local_90);
        setValue<unsigned_long>(this,LVar2,&local_178,local_e0,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if (iStack_220._M_current == local_218) {
          std::vector<el::Configuration*,std::allocator<el::Configuration*>>::
          _M_realloc_insert<el::Configuration*const&>
                    ((vector<el::Configuration*,std::allocator<el::Configuration*>> *)&local_228,
                     iStack_220,&local_200);
        }
        else {
          *iStack_220._M_current = local_200;
          iStack_220._M_current = iStack_220._M_current + 1;
        }
      }
      else if (CVar1 == LogFlushThreshold) {
        LVar2 = local_200->m_level;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        pcVar3 = (local_200->m_value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar3,pcVar3 + (local_200->m_value)._M_string_length);
        local_178 = (code *)getULong(this,&local_b0);
        setValue<unsigned_long>(this,LVar2,&local_178,local_f8,true);
        paVar8 = &local_b0.field_2;
        _Var9._M_p = local_b0._M_dataplus._M_p;
        goto LAB_0011aeca;
      }
      goto switchD_0011a913_caseD_3;
    }
    switch(CVar1) {
    case Enabled:
      LVar2 = local_200->m_level;
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      pcVar3 = (local_200->m_value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_198,pcVar3,pcVar3 + (local_200->m_value)._M_string_length);
      utils::Str::trim(&local_198);
      iVar5 = std::__cxx11::string::compare((char *)&local_198);
      bVar11 = true;
      if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_198), iVar5 != 0)) {
        iVar5 = std::__cxx11::string::compare((char *)&local_198);
        bVar11 = iVar5 == 0;
      }
      local_178._0_1_ = bVar11;
      setValue<bool>(local_208,LVar2,(bool *)&local_178,local_d8,true);
      this = local_208;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p);
        this = local_208;
      }
      break;
    case ToFile:
      LVar2 = local_200->m_level;
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      pcVar3 = (local_200->m_value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,pcVar3,pcVar3 + (local_200->m_value)._M_string_length);
      utils::Str::trim(&local_1b8);
      iVar5 = std::__cxx11::string::compare((char *)&local_1b8);
      bVar11 = true;
      if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_1b8), iVar5 != 0)) {
        iVar5 = std::__cxx11::string::compare((char *)&local_1b8);
        bVar11 = iVar5 == 0;
      }
      local_178._0_1_ = bVar11;
      setValue<bool>(this,LVar2,(bool *)&local_178,local_d0,true);
      paVar8 = &local_1b8.field_2;
      _Var9._M_p = local_1b8._M_dataplus._M_p;
      goto LAB_0011aeca;
    case ToStandardOutput:
      LVar2 = local_200->m_level;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      pcVar3 = (local_200->m_value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,pcVar3,pcVar3 + (local_200->m_value)._M_string_length);
      utils::Str::trim(&local_1d8);
      iVar5 = std::__cxx11::string::compare((char *)&local_1d8);
      bVar11 = true;
      if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_1d8), iVar5 != 0)) {
        iVar5 = std::__cxx11::string::compare((char *)&local_1d8);
        bVar11 = iVar5 == 0;
      }
      local_178._0_1_ = bVar11;
      setValue<bool>(this,LVar2,(bool *)&local_178,local_c8,true);
      paVar8 = &local_1d8.field_2;
      _Var9._M_p = local_1d8._M_dataplus._M_p;
LAB_0011aeca:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var9._M_p != paVar8) {
        operator_delete(_Var9._M_p);
      }
      break;
    case Format:
      LVar2 = local_200->m_level;
      level = local_200->m_level;
      pcVar3 = (local_200->m_value)._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_b8 = plVar6;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_50,pcVar3,pcVar3 + (local_200->m_value)._M_string_length);
      LogFormat::LogFormat((LogFormat *)&local_178,level,&local_50);
      setValue<el::base::LogFormat>(this,LVar2,(LogFormat *)&local_178,local_c0,true);
      LogFormat::~LogFormat((LogFormat *)&local_178);
      plVar6 = local_b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
        plVar6 = local_b8;
      }
    }
switchD_0011a913_caseD_3:
    plVar6 = plVar6 + 1;
  } while( true );
}

Assistant:

void build(Configurations* configurations) {
        base::threading::ScopedLock scopedLock(lock());
        auto getBool = [] (std::string boolStr) -> bool {  // Pass by value for trimming
            base::utils::Str::trim(boolStr);
            return (boolStr == "TRUE" || boolStr == "true" || boolStr == "1");
        };
        std::vector<Configuration*> withFileSizeLimit;
        for (Configurations::const_iterator it = configurations->begin(); it != configurations->end(); ++it) {
            Configuration* conf = *it;
            // We cannot use switch on strong enums because Intel C++ dont support them yet
            if (conf->configurationType() == ConfigurationType::Enabled) {
                setValue(conf->level(), getBool(conf->value()), &m_enabledMap);
            } else if (conf->configurationType() == ConfigurationType::ToFile) {
                setValue(conf->level(), getBool(conf->value()), &m_toFileMap);
            } else if (conf->configurationType() == ConfigurationType::ToStandardOutput) {
                setValue(conf->level(), getBool(conf->value()), &m_toStandardOutputMap);
            } else if (conf->configurationType() == ConfigurationType::Filename) {
            // We do not yet configure filename but we will configure in another
            // loop. This is because if file cannot be created, we will force ToFile
            // to be false. Because configuring logger is not necessarily performance
            // sensative operation, we can live with another loop; (by the way this loop
            // is not very heavy either)
            } else if (conf->configurationType() == ConfigurationType::Format) {
                setValue(conf->level(), base::LogFormat(conf->level(), 
                    base::type::string_t(conf->value().begin(), conf->value().end())), &m_logFormatMap);
            } else if (conf->configurationType() == ConfigurationType::MillisecondsWidth) {
                setValue(Level::Global, 
                    base::MillisecondsWidth(static_cast<int>(getULong(conf->value()))), &m_millisecondsWidthMap);
            } else if (conf->configurationType() == ConfigurationType::PerformanceTracking) {
                setValue(Level::Global, getBool(conf->value()), &m_performanceTrackingMap);
            } else if (conf->configurationType() == ConfigurationType::MaxLogFileSize) {
                setValue(conf->level(), static_cast<std::size_t>(getULong(conf->value())), &m_maxLogFileSizeMap);
#if !defined(ELPP_NO_DEFAULT_LOG_FILE)
                withFileSizeLimit.push_back(conf);
#endif  // !defined(ELPP_NO_DEFAULT_LOG_FILE)
            } else if (conf->configurationType() == ConfigurationType::LogFlushThreshold) {
                setValue(conf->level(), static_cast<std::size_t>(getULong(conf->value())), &m_logFlushThresholdMap);
            }
        }
        // As mentioned early, we will now set filename configuration in separate loop to deal with non-existent files
        for (Configurations::const_iterator it = configurations->begin(); it != configurations->end(); ++it) {
            Configuration* conf = *it;
            if (conf->configurationType() == ConfigurationType::Filename) {
                insertFile(conf->level(), conf->value());
            }
        }
        for (std::vector<Configuration*>::iterator conf = withFileSizeLimit.begin();
                conf != withFileSizeLimit.end(); ++conf) {
                // This is not unsafe as mutex is locked in currect scope
                unsafeValidateFileRolling((*conf)->level(), base::defaultPreRollOutCallback);
        }
    }